

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyMarkRoots(Recycler *this)

{
  code *pcVar1;
  undefined1 this_00 [8];
  NodeBase *this_01;
  bool bVar2;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *node;
  GuestArenaAllocator *pGVar3;
  DListNodeBase<Memory::ArenaData_*> *node_00;
  ArenaData **ppAVar4;
  undefined8 *in_FS_OFFSET;
  ArenaData *local_78;
  undefined1 local_58 [8];
  Iterator externalGuestArenaIter;
  Iterator guestArenaIter;
  Recycler *this_local;
  
  VerifyMark(this,this->transientPinnedObject);
  SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
  ::Map<Memory::Recycler::VerifyMarkRoots()::__0>
            ((SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
              *)&this->pinnedObjectMap,(anon_class_8_1_8991fb9c)this);
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Iterator
            ((Iterator *)&externalGuestArenaIter.current,&this->guestArenaList);
  while( true ) {
    if (guestArenaIter.list == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    this_01 = externalGuestArenaIter.current;
    node = DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                     (&(guestArenaIter.list)->
                       super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    bVar2 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::IsHead
                      ((DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)this_01,node);
    if (bVar2) break;
    guestArenaIter.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)
         DListNodeBase<Memory::Recycler::GuestArenaAllocator>::Next
                   (&(guestArenaIter.list)->
                     super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>);
    pGVar3 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)&externalGuestArenaIter.current);
    if ((pGVar3->pendingDelete & 1U) == 0) {
      pGVar3 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&externalGuestArenaIter.current);
      local_78 = (ArenaData *)0x0;
      if (pGVar3 != (GuestArenaAllocator *)0x0) {
        local_78 = &(pGVar3->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_ArenaData;
      }
      VerifyMarkArena(this,local_78);
    }
    else if ((this->hasPendingDeleteGuestArena & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x213c,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Iterator
            ((Iterator *)local_58,&this->externalGuestArenaList);
  while( true ) {
    if (externalGuestArenaIter.list == (DListBase<Memory::ArenaData_*,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    this_00 = local_58;
    node_00 = DListNodeBase<Memory::ArenaData_*>::Next
                        (&(externalGuestArenaIter.list)->super_DListNodeBase<Memory::ArenaData_*>);
    bVar2 = DListBase<Memory::ArenaData_*,_RealCount>::IsHead
                      ((DListBase<Memory::ArenaData_*,_RealCount> *)this_00,node_00);
    if (bVar2) break;
    externalGuestArenaIter.list =
         (DListBase<Memory::ArenaData_*,_RealCount> *)
         DListNodeBase<Memory::ArenaData_*>::Next
                   (&(externalGuestArenaIter.list)->super_DListNodeBase<Memory::ArenaData_*>);
    ppAVar4 = DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Data((Iterator *)local_58);
    VerifyMarkArena(this,*ppAVar4);
  }
  return;
}

Assistant:

void
Recycler::VerifyMarkRoots()
{
    {
        this->VerifyMark(transientPinnedObject);
        pinnedObjectMap.Map([this](void * obj, PinRecord const &refCount)
        {
            if (refCount == 0)
            {
                Assert(this->hasPendingUnpinnedObject);
            }
            else
            {
                // Use the pinrecord as the source reference
                this->VerifyMark(obj);
            }
        });
    }

    DList<GuestArenaAllocator, HeapAllocator>::Iterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        if (guestArenaIter.Data().pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
        }
        else
        {
            VerifyMarkArena(&guestArenaIter.Data());
        }
    }

    DList<ArenaData *, HeapAllocator>::Iterator externalGuestArenaIter(&externalGuestArenaList);
    while (externalGuestArenaIter.Next())
    {
        VerifyMarkArena(externalGuestArenaIter.Data());
    }

    // We can't check external roots here
}